

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::LoopTestOverS<short,false>
          (BufferTest *this,bool use_range_version,bool skip_rgb)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined3 in_register_00000011;
  
  PrepareProgram(this,s_fragment_shader_idecl_mediump);
  bVar1 = Test<short,4,false>(this,use_range_version);
  if (CONCAT31(in_register_00000011,skip_rgb) == 0) {
    bVar2 = Test<short,3,false>(this,use_range_version);
    bVar1 = bVar1 && bVar2;
  }
  bVar2 = Test<short,2,false>(this,use_range_version);
  bVar3 = Test<short,1,false>(this,use_range_version);
  CleanProgram(this);
  CleanErrors(this);
  return (bool)(bVar3 & bVar2 & bVar1);
}

Assistant:

bool BufferTest::LoopTestOverS(bool use_range_version, bool skip_rgb)
{
	/* Prepare one program per test loop. */
	PrepareProgram(FragmentShaderDeclaration<T, N>());

	/* Run tests. */
	bool result = Test<T, 4, N>(use_range_version);

	if (!skip_rgb)
	{
		result &= Test<T, 3, N>(use_range_version);
	}

	result &= Test<T, 2, N>(use_range_version);
	result &= Test<T, 1, N>(use_range_version);

	/* Cleanup.*/
	CleanProgram();
	CleanErrors();

	/* Pass result. */
	return result;
}